

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O3

shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
 __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
get_connection(ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
               *this)

{
  unique_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  ushort uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  __ptr;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  _func_int **pp_Var6;
  _Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  _Var7;
  string *psVar8;
  undefined8 uVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *in_RSI;
  __node_base *p_Var10;
  uint uVar11;
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  sVar12;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  proxy_host_port;
  string __str;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  local_88;
  _Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_58;
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  this->_vptr_ClientBase = (_func_int **)0x0;
  (this->config).timeout = 0;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&in_RSI->connections_mutex);
  if (iVar5 != 0) {
    uVar9 = std::__throw_system_error(iVar5);
    __clang_call_terminate(uVar9);
  }
  if ((in_RSI->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    local_88.first._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<asio::io_context,std::allocator<asio::io_context>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.first._M_string_length,
               (io_context **)&local_88,(allocator<asio::io_context> *)&local_50);
    sVar4 = local_88.first._M_string_length;
    _Var3._M_p = local_88.first._M_dataplus._M_p;
    local_88.first._M_dataplus._M_p = (pointer)0x0;
    local_88.first._M_string_length = 0;
    p_Var2 = (in_RSI->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (in_RSI->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var3._M_p;
    (in_RSI->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.first._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.first._M_string_length);
    }
    in_RSI->internal_io_service = true;
  }
  p_Var10 = &(in_RSI->connections)._M_h._M_before_begin;
  do {
    p_Var10 = p_Var10->_M_nxt;
    if (p_Var10 == (__node_base *)0x0) goto LAB_001912ec;
  } while (*(char *)&p_Var10[1]._M_nxt[5]._M_nxt != '\0');
  this->_vptr_ClientBase = (_func_int **)p_Var10[1]._M_nxt;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->config,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var10 + 2));
LAB_001912ec:
  pp_Var6 = this->_vptr_ClientBase;
  if (pp_Var6 == (_func_int **)0x0) {
    (*in_RSI->_vptr_ClientBase[2])(&local_88);
    sVar4 = local_88.first._M_string_length;
    _Var3._M_p = local_88.first._M_dataplus._M_p;
    local_88.first._M_dataplus._M_p = (pointer)0x0;
    local_88.first._M_string_length = 0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->config).timeout;
    this->_vptr_ClientBase = (_func_int **)_Var3._M_p;
    (this->config).timeout = sVar4;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.first._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.first._M_string_length);
    }
    std::
    _Hashtable<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>,std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>,std::allocator<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>>,std::hash<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_emplace<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>&>
              ((_Hashtable<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>,std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>,std::allocator<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>>,std::hash<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Connection>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&in_RSI->connections,this);
    pp_Var6 = this->_vptr_ClientBase;
  }
  *(undefined2 *)(pp_Var6 + 5) = 0x101;
  if ((in_RSI->host_port)._M_t.
      super___uniq_ptr_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl ==
      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    this_00 = &in_RSI->host_port;
    if ((in_RSI->config).proxy_server._M_string_length == 0) {
      local_58._M_head_impl =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x40);
      uVar1 = in_RSI->port;
      uVar11 = 1;
      if (((9 < uVar1) && (uVar11 = 2, 99 < uVar1)) && (uVar11 = 3, 999 < uVar1)) {
        uVar11 = 5 - (uVar1 < 10000);
      }
      local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar11);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_88.first._M_dataplus._M_p,uVar11,(uint)uVar1);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (local_58._M_head_impl,&in_RSI->host,&local_88.first);
      _Var7._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
           ._M_head_impl;
      (this_00->_M_t).
      super___uniq_ptr_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl = local_58._M_head_impl;
      if (_Var7._M_head_impl !=
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        std::
        default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator()((default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00,_Var7._M_head_impl);
      }
    }
    else {
      parse_host_port(&local_88,in_RSI,&(in_RSI->config).proxy_server,0x1f90);
      _Var7._M_head_impl =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x40);
      uVar11 = 1;
      if (((9 < local_88.second) && (uVar11 = 2, 99 < local_88.second)) &&
         (uVar11 = 3, 999 < local_88.second)) {
        uVar11 = 5 - (local_88.second < 10000);
      }
      local_50 = &local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar11);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50,uVar11,(uint)local_88.second);
      *(string **)&(_Var7._M_head_impl)->first = (string *)&((_Var7._M_head_impl)->first).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)_Var7._M_head_impl,local_88.first._M_dataplus._M_p,
                 (long)(_func_int ***)local_88.first._M_string_length +
                 local_88.first._M_dataplus._M_p);
      psVar8 = (string *)&((_Var7._M_head_impl)->second).field_2;
      *(string **)&(_Var7._M_head_impl)->second = psVar8;
      if (local_50 == &local_40) {
        *(ulong *)psVar8 = CONCAT71(uStack_3f,local_40);
        *(undefined8 *)((long)((_Var7._M_head_impl)->second).field_2._M_local_buf + 8) = uStack_38;
      }
      else {
        *(char **)&(_Var7._M_head_impl)->second = local_50;
        *(ulong *)&((_Var7._M_head_impl)->second).field_2 = CONCAT71(uStack_3f,local_40);
      }
      *(undefined8 *)&((_Var7._M_head_impl)->second)._M_string_length = local_48;
      local_48 = 0;
      local_40 = '\0';
      __ptr._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
           ._M_head_impl;
      (this_00->_M_t).
      super___uniq_ptr_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl = _Var7._M_head_impl;
      local_50 = &local_40;
      if ((__ptr._M_head_impl !=
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0) &&
         (std::
          default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator()((default_delete<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_00,__ptr._M_head_impl), local_50 != &local_40)) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
      operator_delete(local_88.first._M_dataplus._M_p,
                      local_88.first.field_2._M_allocated_capacity + 1);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&in_RSI->connections_mutex);
  sVar12.
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar12.
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
          )sVar12.
           super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Connection> get_connection() noexcept {
      std::shared_ptr<Connection> connection;
      LockGuard lock(connections_mutex);

      if(!io_service) {
        io_service = std::make_shared<io_context>();
        internal_io_service = true;
      }

      for(auto it = connections.begin(); it != connections.end(); ++it) {
        if(!(*it)->in_use) {
          connection = *it;
          break;
        }
      }
      if(!connection) {
        connection = create_connection();
        connections.emplace(connection);
      }
      connection->attempt_reconnect = true;
      connection->in_use = true;

      if(!host_port) {
        if(config.proxy_server.empty())
          host_port = std::unique_ptr<std::pair<std::string, std::string>>(new std::pair<std::string, std::string>(host, std::to_string(port)));
        else {
          auto proxy_host_port = parse_host_port(config.proxy_server, 8080);
          host_port = std::unique_ptr<std::pair<std::string, std::string>>(new std::pair<std::string, std::string>(proxy_host_port.first, std::to_string(proxy_host_port.second)));
        }
      }

      return connection;
    }